

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void bk_lib::detail::fill<Clasp::Asp::RuleTransform::Impl::TodoItem>
               (TodoItem *first,TodoItem *last,TodoItem *x)

{
  weight_t wVar1;
  
  switch(((uint)((int)last - (int)first) >> 2) * -0x55555555 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_7:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_6:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_5:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_4:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_3:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_2:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
      first = first + 1;
switchD_0014f23a_caseD_1:
      first->head = x->head;
      wVar1 = x->bound;
      first->idx = x->idx;
      first->bound = wVar1;
    }
    break;
  case 1:
    goto switchD_0014f23a_caseD_1;
  case 2:
    goto switchD_0014f23a_caseD_2;
  case 3:
    goto switchD_0014f23a_caseD_3;
  case 4:
    goto switchD_0014f23a_caseD_4;
  case 5:
    goto switchD_0014f23a_caseD_5;
  case 6:
    goto switchD_0014f23a_caseD_6;
  case 7:
    goto switchD_0014f23a_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}